

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall BotscriptParser::parseSwitchDefault(BotscriptParser *this)

{
  _Map_pointer ppSVar1;
  undefined8 in_RAX;
  _Elt_pointer pSVar2;
  DataBuffer *this_00;
  int iVar3;
  difference_type __node_offset_2;
  _Elt_pointer pSVar4;
  difference_type __node_offset;
  long lVar5;
  int iVar6;
  int local_28;
  int local_24;
  
  iVar3 = this->m_scopeCursor;
  local_24 = (int)((ulong)in_RAX >> 0x20);
  _local_28 = CONCAT44(local_24,iVar3);
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  iVar6 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last - (long)pSVar2) >> 3) *
          0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar6 <= iVar3) {
    _local_28 = CONCAT44(iVar6,iVar3);
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_28,&local_24);
    pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    iVar3 = local_28;
  }
  lVar5 = ((long)pSVar2 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf + (long)iVar3;
  if (lVar5 == 0) {
    pSVar4 = pSVar2 + iVar3;
  }
  else {
    pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
  }
  if (pSVar4->type != SCOPE_Switch) {
    error<>("default label outside switch");
    pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  iVar3 = this->m_scopeCursor;
  _local_28 = CONCAT44(local_24,iVar3);
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar6 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last - (long)pSVar2) >> 3) *
          0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar6 <= iVar3) {
    _local_28 = CONCAT44(iVar6,iVar3);
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_28,&local_24);
    pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    iVar3 = local_28;
  }
  lVar5 = ((long)pSVar2 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf + (long)iVar3;
  if (lVar5 == 0) {
    pSVar2 = pSVar2 + iVar3;
  }
  else {
    pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
  }
  if (pSVar2->buffer1 != (DataBuffer *)0x0) {
    error<>("multiple default labels in one switch");
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  this_00 = (DataBuffer *)operator_new(0xb8);
  DataBuffer::DataBuffer(this_00,0x80);
  iVar3 = this->m_scopeCursor;
  _local_28 = CONCAT44(local_24,iVar3);
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  iVar6 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last - (long)pSVar2) >> 3) *
          0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar6 <= iVar3) {
    _local_28 = CONCAT44(iVar6,iVar3);
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_28,&local_24);
    pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    iVar3 = local_28;
  }
  lVar5 = ((long)pSVar2 -
           (long)(this->m_scopeStack)._deque.
                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf + (long)iVar3;
  if (lVar5 == 0) {
    pSVar2 = pSVar2 + iVar3;
  }
  else {
    pSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar5];
  }
  pSVar2->buffer1 = this_00;
  DataBuffer::writeHeader(this_00,Drop);
  DataBuffer::writeHeader(this_00,Goto);
  addSwitchCase(this,this_00);
  return;
}

Assistant:

void BotscriptParser::parseSwitchDefault()
{
	if (SCOPE (0).type != SCOPE_Switch)
		error ("default label outside switch");

	if (SCOPE (0).buffer1 != null)
		error ("multiple default labels in one switch");

	m_lexer->mustGetNext (Token::Colon);

	// The default header is buffered into buffer1, since
	// it has to be the last of the case headers
	//
	// Since the expression is pushed into the switch
	// and is only popped when case succeeds, we have
	// to pop it with DataHeader::Drop manually if we end up in
	// a default.
	DataBuffer* buf = new DataBuffer;
	SCOPE (0).buffer1 = buf;
	buf->writeHeader (DataHeader::Drop);
	buf->writeHeader (DataHeader::Goto);
	addSwitchCase (buf);
}